

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

bool __thiscall mkvparser::Cues::Init(Cues *this)

{
  bool bVar1;
  longlong lVar2;
  longlong lVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  longlong idpos;
  long pos;
  long len;
  long cue_points_size;
  long local_48;
  IMkvReader *local_40;
  long local_38;
  
  bVar4 = true;
  if (this->m_cue_points == (CuePoint **)0x0) {
    if (this->m_preload_count == 0 && this->m_count == 0) {
      local_40 = this->m_pSegment->m_pReader;
      lVar6 = this->m_size + this->m_start;
      local_38 = 0;
      lVar5 = this->m_start;
      while ((((pos = lVar5, bVar4 = lVar6 <= pos, pos < lVar6 &&
               (lVar2 = ReadID(local_40,pos,&local_48), -1 < lVar2)) &&
              (lVar5 = local_48 + pos, lVar5 <= lVar6)) &&
             ((lVar3 = ReadUInt(local_40,lVar5,&local_48), -1 < lVar3 && (lVar5 + local_48 <= lVar6)
              )))) {
        lVar5 = lVar5 + local_48 + lVar3;
        if (lVar6 < lVar5) {
          return bVar4;
        }
        if ((lVar2 == 0xbb) && (bVar1 = PreloadCuePoint(this,&local_38,pos), !bVar1)) {
          return bVar4;
        }
      }
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool Cues::Init() const {
  if (m_cue_points)
    return true;

  if (m_count != 0 || m_preload_count != 0)
    return false;

  IMkvReader* const pReader = m_pSegment->m_pReader;

  const long long stop = m_start + m_size;
  long long pos = m_start;

  long cue_points_size = 0;

  while (pos < stop) {
    const long long idpos = pos;

    long len;

    const long long id = ReadID(pReader, pos, len);
    if (id < 0 || (pos + len) > stop) {
      return false;
    }

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    if (size < 0 || (pos + len > stop)) {
      return false;
    }

    pos += len;  // consume Size field
    if (pos + size > stop) {
      return false;
    }

    if (id == libwebm::kMkvCuePoint) {
      if (!PreloadCuePoint(cue_points_size, idpos))
        return false;
    }

    pos += size;  // skip payload
  }
  return true;
}